

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O3

void __thiscall slang::ast::UnrollVisitor::handle(UnrollVisitor *this,ForLoopStatement *loop)

{
  EvalContext *this_00;
  size_t sVar1;
  ValueSymbol *symbol;
  pointer ppVVar2;
  pointer ppEVar3;
  undefined1 *puVar4;
  char cVar5;
  bool bVar6;
  Expression *this_01;
  UnrollVisitor *this_02;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  SmallVector<slang::ConstantValue_*,_5UL> localPtrs;
  SmallVector<slang::ConstantValue,_16UL> values;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_388;
  undefined8 local_368;
  pointer local_360;
  undefined1 *local_358;
  long local_350;
  undefined8 local_348;
  undefined1 local_340 [40];
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_318;
  char local_2f8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_2f0;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_2c8;
  __index_type local_2a8;
  
  sVar1 = (loop->loopVars)._M_extent._M_extent_value;
  if ((((sVar1 == 0) || (loop->stopExpr == (Expression *)0x0)) ||
      ((loop->steps)._M_extent._M_extent_value == 0)) || (this->anyErrors == true)) {
    Statement::visit<slang::ast::UnrollVisitor&>(loop->body,this);
    return;
  }
  local_358 = local_340;
  local_350 = 0;
  local_348 = 5;
  local_360 = (loop->loopVars)._M_ptr;
  this_00 = &this->evalCtx;
  lVar9 = 0;
  do {
    symbol = *(ValueSymbol **)((long)local_360 + lVar9);
    this_01 = DeclaredType::getInitializer(&symbol->declaredType);
    if (this_01 == (Expression *)0x0) {
      sVar1 = (loop->loopVars)._M_extent._M_extent_value;
      if (sVar1 != 0) {
        ppVVar2 = (loop->loopVars)._M_ptr;
        lVar9 = 0;
        do {
          EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar2 + lVar9));
          lVar9 = lVar9 + 8;
        } while (sVar1 << 3 != lVar9);
      }
      Statement::visit<slang::ast::UnrollVisitor&>(loop->body,this);
      goto LAB_00430368;
    }
    Expression::eval((ConstantValue *)&local_2c8,this_01,this_00);
    if ((long)(char)local_2a8 == 0) {
      sVar1 = (loop->loopVars)._M_extent._M_extent_value;
      if (sVar1 != 0) {
        ppVVar2 = (loop->loopVars)._M_ptr;
        lVar9 = 0;
        do {
          EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar2 + lVar9));
          lVar9 = lVar9 + 8;
        } while (sVar1 << 3 != lVar9);
      }
      Statement::visit<slang::ast::UnrollVisitor&>(loop->body,this);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_2c8);
      goto LAB_00430368;
    }
    local_2f0._M_index = local_2a8;
    local_388._0_8_ = &local_2f0;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&&>
      ::_S_vtable._M_arr[(long)(char)local_2a8 + 1]._M_data)
              ((anon_class_8_1_a78179b7_conflict1 *)&local_388,
               (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)&local_2c8);
    local_318._0_8_ = EvalContext::createLocal(this_00,symbol,(ConstantValue *)&local_2f0);
    SmallVectorBase<slang::ConstantValue*>::emplace_back<slang::ConstantValue*>
              ((SmallVectorBase<slang::ConstantValue*> *)&local_358,(ConstantValue **)&local_318);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_2f0);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_2c8);
    lVar9 = lVar9 + 8;
  } while (sVar1 << 3 != lVar9);
  if (this->setupMode == true) {
    Statement::visit<slang::ast::UnrollVisitor&>(loop->body,this);
    goto LAB_00430368;
  }
  local_2c8._0_8_ = (long)&local_2c8 + 0x18;
  local_2c8._8_8_ = 0;
  local_2c8._16_8_ = 0x10;
  if (this->anyErrors == false) {
    do {
      bVar6 = EvalContext::step(this_00,(SourceLocation)0xffffffffffffffff);
      if (!bVar6) break;
      this_02 = (UnrollVisitor *)loop->stopExpr;
      Expression::eval((ConstantValue *)&local_388,(Expression *)this_02,this_00);
      if ((char)local_368 == '\0') goto LAB_004301cd;
      bVar6 = ConstantValue::isTrue((ConstantValue *)&local_388);
      puVar4 = local_358;
      if (!bVar6) {
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_388);
        uVar10 = 0;
        goto LAB_004303a2;
      }
      if (local_350 != 0) {
        lVar9 = local_350 << 3;
        lVar7 = 0;
        do {
          SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue&>
                    ((SmallVectorBase<slang::ConstantValue> *)&local_2c8,
                     *(ConstantValue **)(puVar4 + lVar7));
          lVar7 = lVar7 + 8;
        } while (lVar9 != lVar7);
      }
      sVar1 = (loop->steps)._M_extent._M_extent_value;
      if (sVar1 != 0) {
        ppEVar3 = (loop->steps)._M_ptr;
        lVar9 = 0;
LAB_004302b9:
        Expression::eval((ConstantValue *)&local_318,*(Expression **)((long)ppEVar3 + lVar9),this_00
                        );
        cVar5 = local_2f8;
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_318);
        if (cVar5 != '\0') goto code_r0x004302dd;
        sVar1 = (loop->loopVars)._M_extent._M_extent_value;
        if (sVar1 != 0) {
          ppVVar2 = (loop->loopVars)._M_ptr;
          lVar9 = 0;
          do {
            EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar2 + lVar9));
            lVar9 = lVar9 + 8;
          } while (sVar1 << 3 != lVar9);
        }
        Statement::visit<slang::ast::UnrollVisitor&>(loop->body,this);
        goto LAB_00430351;
      }
LAB_004302e6:
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_388);
    } while (this->anyErrors == false);
  }
  this->anyErrors = true;
  local_388._16_8_ = 0;
  local_388._24_8_ = 0;
  local_388._0_8_ =
       (_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        *)0x0;
  local_388._8_8_ = 0;
  local_368 = 0;
LAB_004301cd:
  sVar1 = (loop->loopVars)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppVVar2 = (loop->loopVars)._M_ptr;
    lVar9 = 0;
    do {
      EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar2 + lVar9));
      lVar9 = lVar9 + 8;
    } while (sVar1 << 3 != lVar9);
  }
  Statement::visit<slang::ast::UnrollVisitor&>(loop->body,this);
LAB_00430351:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_388);
  this_02 = this;
  goto LAB_0043035b;
code_r0x004302dd:
  lVar9 = lVar9 + 8;
  if (sVar1 << 3 == lVar9) goto LAB_004302e6;
  goto LAB_004302b9;
  while( true ) {
    if (local_350 != 0) {
      lVar8 = local_350 << 3;
      lVar9 = uVar10 * 0x28;
      lVar7 = 0;
      do {
        local_388._0_8_ = *(undefined8 *)(puVar4 + lVar7);
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
          ::_S_vtable._M_arr[(long)*(char *)(local_2c8._0_8_ + 0x20 + lVar9) + 1]._M_data)
                  ((anon_class_8_1_8991fb9c *)&local_388,
                   (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)(local_2c8._0_8_ + lVar9));
        uVar10 = uVar10 + 1;
        lVar7 = lVar7 + 8;
        lVar9 = lVar9 + 0x28;
      } while (lVar8 != lVar7);
    }
    this_02 = this;
    Statement::visit<slang::ast::UnrollVisitor&>(loop->body,this);
    if (this->anyErrors != false) break;
LAB_004303a2:
    puVar4 = local_358;
    if ((ulong)local_2c8._8_8_ <= uVar10) break;
  }
LAB_0043035b:
  SmallVectorBase<slang::ConstantValue>::cleanup
            ((SmallVectorBase<slang::ConstantValue> *)&local_2c8,(EVP_PKEY_CTX *)this_02);
LAB_00430368:
  if (local_358 != local_340) {
    operator_delete(local_358);
  }
  return;
}

Assistant:

void handle(const ForLoopStatement& loop) {
        if (loop.loopVars.empty() || !loop.stopExpr || loop.steps.empty() || anyErrors) {
            loop.body.visit(*this);
            return;
        }

        // Attempt to unroll the loop. If we are unable to collect constant values
        // for all loop variables across all iterations, we won't unroll at all.
        auto handleFail = [&] {
            for (auto var : loop.loopVars)
                evalCtx.deleteLocal(var);
            loop.body.visit(*this);
        };

        SmallVector<ConstantValue*> localPtrs;
        for (auto var : loop.loopVars) {
            auto init = var->getInitializer();
            if (!init) {
                handleFail();
                return;
            }

            auto cv = init->eval(evalCtx);
            if (!cv) {
                handleFail();
                return;
            }

            localPtrs.push_back(evalCtx.createLocal(var, std::move(cv)));
        }

        // In setup mode we just do a single pass with our loop vars
        // defined to build the initial map of assignments.
        if (setupMode) {
            loop.body.visit(*this);
            return;
        }

        SmallVector<ConstantValue, 16> values;
        while (true) {
            auto cv = step() ? loop.stopExpr->eval(evalCtx) : ConstantValue();
            if (!cv) {
                handleFail();
                return;
            }

            if (!cv.isTrue())
                break;

            for (auto local : localPtrs)
                values.emplace_back(*local);

            for (auto step : loop.steps) {
                if (!step->eval(evalCtx)) {
                    handleFail();
                    return;
                }
            }
        }

        // We have all the loop iteration values. Go back through
        // and visit the loop body for each iteration.
        for (size_t i = 0; i < values.size();) {
            for (auto local : localPtrs)
                *local = std::move(values[i++]);

            loop.body.visit(*this);
            if (anyErrors)
                return;
        }
    }